

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
jessilib::string_cast<char16_t,char32_t[5]>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,jessilib *this,char32_t (*in_string) [5])

{
  long lVar1;
  size_t __i;
  long lVar2;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  lVar2 = 0;
  do {
    lVar1 = lVar2 * 4;
    lVar2 = lVar2 + 1;
  } while (*(int *)(this + lVar1) != 0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  reserve(&local_50,0);
  for (lVar1 = 1; lVar2 != lVar1; lVar1 = lVar1 + 1) {
    encode_codepoint_utf16<char16_t,std::__cxx11::u16string>
              (&local_50,*(char32_t *)(this + lVar1 * 4 + -4));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}